

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O1

void set_soonest_timeout(timeval *timeout,periodic_task_handle_conflict task_list,timeval now)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  for (; task_list != (periodic_task_handle_conflict)0x0; task_list = task_list->next) {
    if (task_list->executing == 0xffffffffffffffff) {
      lVar2 = (task_list->next_time).tv_usec - now.tv_usec;
      lVar3 = lVar2 + 1000000;
      if (-1 < lVar2) {
        lVar3 = lVar2;
      }
      lVar2 = (lVar2 >> 0x3f) + ((task_list->next_time).tv_sec - now.tv_sec);
      if (lVar2 < 0) {
        lVar3 = 0;
      }
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      lVar1 = timeout->tv_sec;
      if (((lVar1 == -1) || (lVar2 < lVar1)) || ((lVar2 == lVar1 && (lVar3 < timeout->tv_usec)))) {
        timeout->tv_sec = lVar2;
        timeout->tv_usec = lVar3;
      }
    }
  }
  return;
}

Assistant:

static void
set_soonest_timeout(struct timeval *timeout, periodic_task_handle task_list, struct timeval now)
{
    struct timeval this_delay;
    if (task_list == NULL) return;
    this_delay.tv_sec = task_list->next_time.tv_sec - now.tv_sec;
    this_delay.tv_usec = task_list->next_time.tv_usec - now.tv_usec;
    if (task_list->executing == (thr_thread_id)-1) {
	/* this task not executing already, see when it needs to run  */
	if (this_delay.tv_usec < 0) {
	    this_delay.tv_sec--;
	    this_delay.tv_usec += 1000000;
	}
	if (this_delay.tv_sec < 0) {
	    this_delay.tv_sec = this_delay.tv_usec = 0;
	}
	if ((timeout->tv_sec == -1) || (timercmp(&this_delay, timeout, <))) {
	    *timeout = this_delay;
	}
    }
    set_soonest_timeout(timeout, task_list->next, now);
}